

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat format)

{
  char *__s;
  string local_70;
  allocator<char> local_39;
  string local_38 [8];
  string fullName;
  VkFormat format_local;
  
  fullName.field_2._12_4_ = SUB84(this,0);
  __s = ::vk::getFormatName(fullName.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)local_38);
  de::toLower(__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getFormatCaseName (VkFormat format)
{
	const std::string fullName = getFormatName(format);

	DE_ASSERT(de::beginsWith(fullName, "VK_FORMAT_"));

	return de::toLower(fullName.substr(10));
}